

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SequenceDeclarationSyntax::setChild
          (SequenceDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048eb58 + *(int *)(&DAT_0048eb58 + index * 4)))();
  return;
}

Assistant:

void SequenceDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<AssertionItemPortListSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        case 5: variables = child.node()->as<SyntaxList<LocalVariableDeclarationSyntax>>(); return;
        case 6: seqExpr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 7: optionalSemi = child.token(); return;
        case 8: end = child.token(); return;
        case 9: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}